

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_sendto(int sock,void *data,size_t len,sockaddr_can *addr,
                   isobusfs_buf_log *isobusfs_tx_buffer)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  sockaddr *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int ret;
  uint8_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  uint local_4;
  
  isobufs_store_tx_data
            ((isobusfs_buf_log *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  sVar1 = sendto(in_EDI,in_RSI,in_RDX,0x40,in_RCX,0x18);
  if ((int)sVar1 == -1) {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
    uVar4 = local_4;
    pcVar3 = strerror(local_4);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send data: %i (%s)",(ulong)uVar4,pcVar3);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int isobusfs_sendto(int sock, const void *data, size_t len,
		    const struct sockaddr_can *addr,
		    struct isobusfs_buf_log *isobusfs_tx_buffer)
{
	int ret;

	/* store to tx buffer */
	isobufs_store_tx_data(isobusfs_tx_buffer, (uint8_t *)data);

	ret = sendto(sock, data, len, MSG_DONTWAIT,
		     (struct sockaddr *)addr, sizeof(*addr));
	if (ret == -1) {
		ret = -errno;
		pr_warn("failed to send data: %i (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}